

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall
helics::FederateState::callbackReturnResult
          (FederateState *this,FederateStates lastState,MessageProcessingResult result,
          FederateStates newState)

{
  uint uVar1;
  element_type *peVar2;
  pointer this_00;
  char in_CL;
  byte in_DL;
  char in_SIL;
  FederateState *in_RDI;
  __sv_type _Var3;
  ActionMessage bye_1;
  exception *e;
  ActionMessage bye;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  IterationRequest in_stack_fffffffffffffe3e;
  MessageProcessingResult in_stack_fffffffffffffe3f;
  FederateState *in_stack_fffffffffffffe40;
  IterationRequest in_stack_fffffffffffffe56;
  MessageProcessingResult in_stack_fffffffffffffe57;
  FederateState *in_stack_fffffffffffffe58;
  Time in_stack_fffffffffffffe60;
  size_t local_30;
  char *local_28;
  
  if ((in_SIL != in_CL) && (in_CL != '\x03')) {
    if (in_CL == '\x04') {
      if (in_SIL == '\x05') {
        return;
      }
      peVar2 = std::
               __shared_ptr_access<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4c0db2);
      uVar1 = lastErrorCode(in_RDI);
      lastErrorString_abi_cxx11_(in_RDI);
      _Var3 = std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffe00);
      local_30 = _Var3._M_len;
      local_28 = _Var3._M_str;
      (*peVar2->_vptr_FederateOperator[5])(peVar2,(ulong)uVar1,local_30,local_28);
      return;
    }
    if (in_CL == '\x05') {
      if (in_SIL == '\x04') {
        return;
      }
      peVar2 = std::
               __shared_ptr_access<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<helics::FederateOperator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4c0bcc);
      (*peVar2->_vptr_FederateOperator[4])();
      return;
    }
  }
  if ((in_DL & 0xfd) == 0) {
    if (in_SIL == '\0') {
      initCallbackProcessing((FederateState *)bye_1.actionTime.internalTimeCode);
    }
    else if (in_SIL == '\x01') {
      if (in_CL == '\x01') {
        updateDataForExecEntry
                  (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3f,in_stack_fffffffffffffe3e);
        initCallbackProcessing((FederateState *)bye_1.actionTime.internalTimeCode);
      }
      else {
        updateDataForExecEntry
                  (in_stack_fffffffffffffe40,in_stack_fffffffffffffe3f,in_stack_fffffffffffffe3e);
        execCallbackProcessing
                  ((FederateState *)bye_1.payload.buffer._M_elems._16_8_,
                   bye_1.payload.buffer._M_elems[0xf]);
      }
    }
    else if (in_SIL == '\x02') {
      this_00 = std::
                unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
                operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                            *)0x4c0ee5);
      TimeCoordinator::getRequestedTime(this_00);
      updateDataForTimeReturn
                (in_stack_fffffffffffffe58,in_stack_fffffffffffffe57,in_stack_fffffffffffffe60,
                 in_stack_fffffffffffffe56);
      execCallbackProcessing
                ((FederateState *)bye_1.payload.buffer._M_elems._16_8_,
                 bye_1.payload.buffer._M_elems[0xf]);
    }
  }
  return;
}

Assistant:

void FederateState::callbackReturnResult(FederateStates lastState,
                                         MessageProcessingResult result,
                                         FederateStates newState) noexcept
{
    try {
        // handle some general new states
        if (lastState != newState) {
            switch (newState) {
                case FederateStates::TERMINATING:
                    break;
                case FederateStates::FINISHED:
                    if (lastState != FederateStates::ERRORED) {
                        fedCallbacks->finalize();
                    }
                    return;
                case FederateStates::ERRORED:
                    if (lastState != FederateStates::FINISHED) {
                        fedCallbacks->error_handler(lastErrorCode(), lastErrorString());
                    }
                    return;
                default:
                    break;
            }
        }
        switch (result) {
            case MessageProcessingResult::ITERATING:
            case MessageProcessingResult::NEXT_STEP:
                // these are the only 2 results that warrant further processing
                break;
            default:
                return;
        }
        switch (lastState) {
            case FederateStates::CREATED:
                // this is the only valid transition that hasn't been dealt with yet
                initCallbackProcessing();
                break;
            case FederateStates::INITIALIZING:
                if (newState == FederateStates::INITIALIZING) {
                    updateDataForExecEntry(result, lastIterationRequest);
                    initCallbackProcessing();
                } else {
                    updateDataForExecEntry(result, lastIterationRequest);
                    execCallbackProcessing(IterationResult::NEXT_STEP);
                }
                break;
            case FederateStates::EXECUTING:
                updateDataForTimeReturn(result,
                                        timeCoord->getRequestedTime(),
                                        lastIterationRequest);
                execCallbackProcessing(result == MessageProcessingResult::ITERATING ?
                                           IterationResult::ITERATING :
                                           IterationResult::NEXT_STEP);
                break;
            default:
                break;
        }
    }
    catch (const std::exception& e) {
        if (newState != FederateStates::ERRORED && newState != FederateStates::FINISHED) {
            ActionMessage bye(CMD_LOCAL_ERROR);
            bye.source_id = global_id.load();
            bye.dest_id = bye.source_id;
            bye.messageID = HELICS_USER_EXCEPTION;
            bye.payload = e.what();
            mParent->addActionMessage(bye);
        }
    }
    catch (...) {
        if (newState != FederateStates::ERRORED && newState != FederateStates::FINISHED) {
            ActionMessage bye(CMD_LOCAL_ERROR);
            bye.source_id = global_id.load();
            bye.dest_id = bye.source_id;
            bye.messageID = HELICS_USER_EXCEPTION;
            bye.payload = "unrecognized exception thrown in federate callback";
            mParent->addActionMessage(bye);
        }
    }
}